

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

void __thiscall Args::CmdLine::~CmdLine(CmdLine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppCVar3;
  
  pcVar2 = (this->m_positionalDescription)._M_dataplus._M_p;
  paVar1 = &(this->m_positionalDescription).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_positional);
  ppCVar3 = (this->m_prevCommand).
            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar3 != (pointer)0x0) {
    operator_delete(ppCVar3,(long)(this->m_prevCommand).
                                  super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar3
                   );
  }
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::~vector(&this->m_args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_context).m_context);
  return;
}

Assistant:

virtual ~CmdLine()
	{
	}